

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9CompileUplink(jx9_gen_state *pGen)

{
  SyToken *pSVar1;
  SyToken *pEnd;
  sxi32 sVar2;
  int iP1;
  SyToken *pStart;
  SyToken *pNext;
  
  pNext = (SyToken *)0x0;
  pSVar1 = pGen->pIn;
  pEnd = pGen->pEnd;
  pStart = pSVar1 + 1;
  pGen->pIn = pStart;
  if ((pStart < pEnd) && ((pSVar1[1].nType & 0x40000) == 0)) {
    iP1 = 0;
    while (sVar2 = jx9GetNextExpr(pStart,pEnd,&pNext), pStart = pNext, sVar2 == 0) {
      pSVar1 = pGen->pIn;
      if (pSVar1 < pNext) {
        pGen->pEnd = pNext;
        if ((pSVar1->nType & 0x10) == 0) {
          sVar2 = jx9GenCompileError(pGen,1,pSVar1->nLine,"uplink: Expected variable name");
          if (sVar2 == -10) {
            return -10;
          }
        }
        else {
          pGen->pIn = pSVar1 + 1;
          if (pSVar1 + 1 < pNext) {
            sVar2 = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
            if (sVar2 != -3) {
              if (sVar2 == -10) {
                return -10;
              }
              iP1 = iP1 + 1;
            }
          }
          else {
            jx9GenCompileError(pGen,2,pSVar1->nLine,"uplink: Empty variable name");
          }
        }
      }
      for (; (pStart < pEnd && ((pStart->nType & 0x20000) != 0)); pStart = pStart + 1) {
      }
      pGen->pIn = pStart;
    }
    pGen->pEnd = pEnd;
    if (0 < iP1) {
      jx9VmEmitInstr(pGen->pVm,0x40,iP1,0,(void *)0x0,(sxu32 *)0x0);
    }
  }
  return 0;
}

Assistant:

static sxi32 jx9CompileUplink(jx9_gen_state *pGen)
{
	SyToken *pTmp, *pNext = 0;
	sxi32 nExpr;
	sxi32 rc;
	/* Jump the 'uplink' keyword */
	pGen->pIn++;
	if( pGen->pIn >= pGen->pEnd || (pGen->pIn->nType & JX9_TK_SEMI) ){
		/* Nothing to process */
		return SXRET_OK;
	}
	pTmp = pGen->pEnd;
	nExpr = 0;
	while( SXRET_OK == jx9GetNextExpr(pGen->pIn, pTmp, &pNext) ){
		if( pGen->pIn < pNext ){
			pGen->pEnd = pNext;
			if( (pGen->pIn->nType & JX9_TK_DOLLAR) == 0 ){
				rc = jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, "uplink: Expected variable name");
				if( rc == SXERR_ABORT ){
					return SXERR_ABORT;
				}
			}else{
				pGen->pIn++;
				if( pGen->pIn >= pGen->pEnd ){
					/* Emit a warning */
					jx9GenCompileError(&(*pGen), E_WARNING, pGen->pIn[-1].nLine, "uplink: Empty variable name");
				}else{
					rc = jx9CompileExpr(&(*pGen), 0, 0);
					if( rc == SXERR_ABORT ){
						return SXERR_ABORT;
					}else if(rc != SXERR_EMPTY ){
						nExpr++;
					}
				}
			}
		}
		/* Next expression in the stream */
		pGen->pIn = pNext;
		/* Jump trailing commas */
		while( pGen->pIn < pTmp && (pGen->pIn->nType & JX9_TK_COMMA) ){
			pGen->pIn++;
		}
	}
	/* Restore token stream */
	pGen->pEnd = pTmp;
	if( nExpr > 0 ){
		/* Emit the uplink instruction */
		jx9VmEmitInstr(pGen->pVm, JX9_OP_UPLINK, nExpr, 0, 0, 0);
	}
	return SXRET_OK;
}